

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O2

int32_t unistrTextReplace(UText *ut,int64_t start,int64_t limit,UChar *src,int32_t length,
                         UErrorCode *pErrorCode)

{
  short sVar1;
  UnicodeString *this;
  int32_t iVar2;
  int32_t offset;
  int iVar3;
  long lVar4;
  char16_t *pcVar5;
  int32_t iVar6;
  int64_t iVar7;
  ConstChar16Ptr local_48;
  UChar *local_40;
  
  iVar3 = 0;
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    this = (UnicodeString *)ut->context;
    if (length != 0 && src == (UChar *)0x0) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    if (limit < start) {
      *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      iVar3 = 0;
    }
    else {
      sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar6 = (this->fUnion).fFields.fLength;
      }
      else {
        iVar6 = (int)sVar1 >> 5;
      }
      lVar4 = (long)iVar6;
      iVar7 = start;
      if (lVar4 < start) {
        iVar7 = lVar4;
      }
      iVar2 = (int32_t)iVar7;
      if (start < 0) {
        iVar2 = 0;
      }
      iVar7 = limit;
      if (lVar4 < limit) {
        iVar7 = lVar4;
      }
      offset = (int32_t)iVar7;
      if (limit < 0) {
        offset = 0;
      }
      if (iVar2 < iVar6) {
        iVar2 = icu_63::UnicodeString::getChar32Start(this,iVar2);
      }
      if (offset < iVar6) {
        offset = icu_63::UnicodeString::getChar32Start(this,offset);
      }
      local_48.p_ = src;
      icu_63::UnicodeString::replace(this,iVar2,offset - iVar2,&local_48,length);
      local_40 = local_48.p_;
      sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar2 = (this->fUnion).fFields.fLength;
      }
      else {
        iVar2 = (int)sVar1 >> 5;
      }
      pcVar5 = icu_63::UnicodeString::getBuffer(this);
      ut->chunkContents = pcVar5;
      ut->chunkLength = iVar2;
      ut->chunkNativeLimit = (long)iVar2;
      ut->nativeIndexingLimit = iVar2;
      iVar3 = iVar2 - iVar6;
      ut->chunkOffset = offset + iVar3;
    }
  }
  return iVar3;
}

Assistant:

static int32_t U_CALLCONV
unistrTextReplace(UText *ut,
                  int64_t start, int64_t limit,
                  const UChar *src, int32_t length,
                  UErrorCode *pErrorCode) {
    UnicodeString *us=(UnicodeString *)ut->context;
    int32_t oldLength;

    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(src==NULL && length!=0) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
    }
    if(start>limit) {
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }
    oldLength=us->length();
    int32_t start32 = pinIndex(start, oldLength);
    int32_t limit32 = pinIndex(limit, oldLength);
    if (start32 < oldLength) {
        start32 = us->getChar32Start(start32);
    }
    if (limit32 < oldLength) {
        limit32 = us->getChar32Start(limit32);
    }

    // replace
    us->replace(start32, limit32-start32, src, length);
    int32_t newLength = us->length();

    // Update the chunk description.
    ut->chunkContents    = us->getBuffer();
    ut->chunkLength      = newLength;
    ut->chunkNativeLimit = newLength;
    ut->nativeIndexingLimit = newLength;

    // Set iteration position to the point just following the newly inserted text.
    int32_t lengthDelta = newLength - oldLength;
    ut->chunkOffset = limit32 + lengthDelta;

    return lengthDelta;
}